

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::serializedata<GlobalStimulationSettings::CurrentScaling_const>
          (CurrentScaling *args)

{
  Options OVar1;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_RDI;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *this;
  string local_2d0 [32];
  Options *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  ostringstream local_188 [392];
  
  this = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)
             CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,in_stack_fffffffffffffd50);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (this,(CurrentScaling *)in_RDI);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata((binarydata *)this,(string *)in_RDI);
  std::__cxx11::string::~string(local_2d0);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x386958);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return (binarydata *)this;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }